

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_ManMultiAig_rec(Dam_Man_t *pMan,Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iLit0;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pTemp;
  int *pSet;
  int i;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  Dam_Man_t *pMan_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                    ,0x2f6,
                    "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjId(p,pObj);
    piVar4 = Dam_ObjSet(pMan,iVar1);
    if (piVar4 == (int *)0x0) {
      pGVar5 = Gia_ObjFanin0(pObj);
      Dam_ManMultiAig_rec(pMan,pNew,p,pGVar5);
      pGVar5 = Gia_ObjFanin1(pObj);
      Dam_ManMultiAig_rec(pMan,pNew,p,pGVar5);
      iVar1 = Gia_ObjIsMux(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsXor(pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFanin0Copy(pObj);
          iVar2 = Gia_ObjFanin1Copy(pObj);
          uVar3 = Gia_ManHashAnd(pNew,iVar1,iVar2);
          pObj->Value = uVar3;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(pObj);
          iVar2 = Gia_ObjFanin1Copy(pObj);
          uVar3 = Gia_ManHashXorReal(pNew,iVar1,iVar2);
          pObj->Value = uVar3;
        }
      }
      else {
        pGVar5 = Gia_ObjFanin2(p,pObj);
        Dam_ManMultiAig_rec(pMan,pNew,p,pGVar5);
        iVar1 = Gia_ObjFanin2Copy(p,pObj);
        iVar2 = Gia_ObjFanin1Copy(pObj);
        iLit0 = Gia_ObjFanin0Copy(pObj);
        uVar3 = Gia_ManHashMuxReal(pNew,iVar1,iVar2,iLit0);
        pObj->Value = uVar3;
      }
      iVar1 = Abc_Lit2Var(pObj->Value);
      pGVar5 = Gia_ManObj(pNew,iVar1);
      Gia_ObjSetGateLevel(pNew,pGVar5);
    }
    else {
      iVar1 = Gia_ObjIsXor(pObj);
      if ((iVar1 == 0) && (iVar1 = Gia_ObjIsAndReal(p,pObj), iVar1 == 0)) {
        __assert_fail("Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x308,
                      "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      for (pSet._4_4_ = 1; pSet._4_4_ <= *piVar4; pSet._4_4_ = pSet._4_4_ + 1) {
        iVar1 = Abc_Lit2Var(piVar4[pSet._4_4_]);
        pGVar5 = Gia_ManObj(p,iVar1);
        Dam_ManMultiAig_rec(pMan,pNew,p,pGVar5);
        uVar3 = pGVar5->Value;
        iVar1 = Abc_LitIsCompl(piVar4[pSet._4_4_]);
        iVar1 = Abc_LitNotCond(uVar3,iVar1);
        piVar4[pSet._4_4_] = iVar1;
      }
      uVar3 = Gia_ManBalanceGate(pNew,pObj,p->vSuper,piVar4 + 1,*piVar4);
      pObj->Value = uVar3;
    }
  }
  return;
}

Assistant:

void Dam_ManMultiAig_rec( Dam_Man_t * pMan, Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int i, * pSet;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pSet = Dam_ObjSet(pMan, Gia_ObjId(p, pObj));
    if ( pSet == NULL )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin2(p, pObj) );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    assert( Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj) );
    // call recursively
    for ( i = 1; i <= pSet[0]; i++ )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(pSet[i]) );
        Dam_ManMultiAig_rec( pMan, pNew, p, pTemp );
        pSet[i] = Abc_LitNotCond( pTemp->Value, Abc_LitIsCompl(pSet[i]) );
    }
    // create balanced gate
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, pSet + 1, pSet[0] );
}